

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ReadAnimationSampler(ColladaParser *this,AnimationChannel *pChannel)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  char *local_38;
  char *source;
  char *pcStack_28;
  int indexSource;
  char *semantic;
  AnimationChannel *pAStack_18;
  int indexSemantic;
  AnimationChannel *pChannel_local;
  ColladaParser *this_local;
  
  pAStack_18 = pChannel;
  pChannel_local = (AnimationChannel *)this;
  while( true ) {
    while( true ) {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 == 1) break;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 == 2) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"sampler");
          if (iVar3 == 0) {
            return;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_90,"Expected end of <sampler> element.",&local_91);
          ThrowException(this,&local_90);
        }
      }
      bVar1 = IsElement(this,"input");
      if (bVar1) break;
      SkipElement(this);
    }
    semantic._4_4_ = GetAttribute(this,"semantic");
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)semantic._4_4_);
    pcStack_28 = (char *)CONCAT44(extraout_var,iVar3);
    source._4_4_ = GetAttribute(this,"source");
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)source._4_4_);
    local_38 = (char *)CONCAT44(extraout_var_00,iVar3);
    if (*local_38 != '#') break;
    local_38 = local_38 + 1;
    iVar3 = strcmp(pcStack_28,"INPUT");
    if (iVar3 == 0) {
      std::__cxx11::string::operator=((string *)&pAStack_18->mSourceTimes,local_38);
    }
    else {
      iVar3 = strcmp(pcStack_28,"OUTPUT");
      if (iVar3 == 0) {
        std::__cxx11::string::operator=((string *)&pAStack_18->mSourceValues,local_38);
      }
      else {
        iVar3 = strcmp(pcStack_28,"IN_TANGENT");
        if (iVar3 == 0) {
          std::__cxx11::string::operator=((string *)&pAStack_18->mInTanValues,local_38);
        }
        else {
          iVar3 = strcmp(pcStack_28,"OUT_TANGENT");
          if (iVar3 == 0) {
            std::__cxx11::string::operator=((string *)&pAStack_18->mOutTanValues,local_38);
          }
          else {
            iVar3 = strcmp(pcStack_28,"INTERPOLATION");
            if (iVar3 == 0) {
              std::__cxx11::string::operator=((string *)&pAStack_18->mInterpolationValues,local_38);
            }
          }
        }
      }
    }
    uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
    if ((uVar2 & 1) == 0) {
      SkipElement(this);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"Unsupported URL format",&local_59);
  ThrowException(this,&local_58);
}

Assistant:

void ColladaParser::ReadAnimationSampler(Collada::AnimationChannel& pChannel)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* semantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* source = mReader->getAttributeValue(indexSource);
                if (source[0] != '#')
                    ThrowException("Unsupported URL format");
                source++;

                if (strcmp(semantic, "INPUT") == 0)
                    pChannel.mSourceTimes = source;
                else if (strcmp(semantic, "OUTPUT") == 0)
                    pChannel.mSourceValues = source;
                else if (strcmp(semantic, "IN_TANGENT") == 0)
                    pChannel.mInTanValues = source;
                else if (strcmp(semantic, "OUT_TANGENT") == 0)
                    pChannel.mOutTanValues = source;
                else if (strcmp(semantic, "INTERPOLATION") == 0)
                    pChannel.mInterpolationValues = source;

                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "sampler") != 0)
                ThrowException("Expected end of <sampler> element.");

            break;
        }
    }
}